

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

GLFWbool createShellObjects(_GLFWwindow *window)

{
  int iVar1;
  wl_surface *pwVar2;
  wl_output *pwVar3;
  xdg_toplevel *pxVar4;
  xdg_wm_base *pxVar5;
  zxdg_decoration_manager_v1 *pzVar6;
  PFN_wl_proxy_marshal_flags p_Var7;
  uint32_t uVar8;
  libdecor_frame *plVar9;
  libdecor_state *plVar10;
  wl_proxy *pwVar11;
  char *pcVar12;
  GLFWbool GVar13;
  
  if (_glfw.wl.libdecor.context == (libdecor *)0x0) {
LAB_001253a0:
    p_Var7 = _glfw.wl.client.proxy_marshal_flags;
    pxVar5 = _glfw.wl.wmBase;
    pwVar2 = (window->wl).surface;
    uVar8 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.wmBase);
    pwVar11 = (*p_Var7)((wl_proxy *)pxVar5,2,&_glfw_xdg_surface_interface,uVar8,0,0,pwVar2);
    (window->wl).xdg.surface = (xdg_surface *)pwVar11;
    if (pwVar11 == (wl_proxy *)0x0) {
      pcVar12 = "Wayland: Failed to create xdg-surface for window";
    }
    else {
      (*_glfw.wl.client.proxy_add_listener)(pwVar11,(_func_void **)&xdgSurfaceListener,window);
      p_Var7 = _glfw.wl.client.proxy_marshal_flags;
      pwVar11 = (wl_proxy *)(window->wl).xdg.surface;
      uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
      pwVar11 = (*p_Var7)(pwVar11,1,&_glfw_xdg_toplevel_interface,uVar8,0,0);
      (window->wl).xdg.toplevel = (xdg_toplevel *)pwVar11;
      if (pwVar11 != (wl_proxy *)0x0) {
        (*_glfw.wl.client.proxy_add_listener)(pwVar11,(_func_void **)&xdgToplevelListener,window);
        p_Var7 = _glfw.wl.client.proxy_marshal_flags;
        pcVar12 = (window->wl).appId;
        if (pcVar12 != (char *)0x0) {
          pwVar11 = (wl_proxy *)(window->wl).xdg.toplevel;
          uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
          (*p_Var7)(pwVar11,3,(wl_interface *)0x0,uVar8,0,pcVar12);
        }
        p_Var7 = _glfw.wl.client.proxy_marshal_flags;
        pwVar11 = (wl_proxy *)(window->wl).xdg.toplevel;
        pcVar12 = window->title;
        uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
        (*p_Var7)(pwVar11,2,(wl_interface *)0x0,uVar8,0,pcVar12);
        p_Var7 = _glfw.wl.client.proxy_marshal_flags;
        if (window->monitor == (_GLFWmonitor *)0x0) {
          if ((window->wl).maximized != 0) {
            pwVar11 = (wl_proxy *)(window->wl).xdg.toplevel;
            uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
            (*p_Var7)(pwVar11,9,(wl_interface *)0x0,uVar8,0);
          }
          p_Var7 = _glfw.wl.client.proxy_marshal_flags;
          pwVar11 = (wl_proxy *)(window->wl).idleInhibitor;
          if (pwVar11 != (wl_proxy *)0x0) {
            uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
            (*p_Var7)(pwVar11,0,(wl_interface *)0x0,uVar8,1);
            (window->wl).idleInhibitor = (zwp_idle_inhibitor_v1 *)0x0;
          }
        }
        else {
          pwVar11 = (wl_proxy *)(window->wl).xdg.toplevel;
          pwVar3 = (window->monitor->wl).output;
          uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
          (*p_Var7)(pwVar11,0xb,(wl_interface *)0x0,uVar8,0,pwVar3);
          setIdleInhibitor(window,1);
        }
        p_Var7 = _glfw.wl.client.proxy_marshal_flags;
        pzVar6 = _glfw.wl.decorationManager;
        if (_glfw.wl.decorationManager == (zxdg_decoration_manager_v1 *)0x0) {
          if ((window->decorated != 0) && (window->monitor == (_GLFWmonitor *)0x0)) {
            createFallbackDecorations(window);
          }
        }
        else {
          pxVar4 = (window->wl).xdg.toplevel;
          uVar8 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.decorationManager);
          pwVar11 = (*p_Var7)((wl_proxy *)pzVar6,1,&_glfw_zxdg_toplevel_decoration_v1_interface,
                              uVar8,0,0,pxVar4);
          (window->wl).xdg.decoration = (zxdg_toplevel_decoration_v1 *)pwVar11;
          (*_glfw.wl.client.proxy_add_listener)
                    (pwVar11,(_func_void **)&xdgDecorationListener,window);
          p_Var7 = _glfw.wl.client.proxy_marshal_flags;
          iVar1 = window->decorated;
          pwVar11 = (wl_proxy *)(window->wl).xdg.decoration;
          uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
          (*p_Var7)(pwVar11,1,(wl_interface *)0x0,uVar8,0,(ulong)(2 - (iVar1 == 0)));
        }
        updateXdgSizeLimits(window);
        p_Var7 = _glfw.wl.client.proxy_marshal_flags;
        pwVar11 = (wl_proxy *)(window->wl).surface;
        uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
        (*p_Var7)(pwVar11,6,(wl_interface *)0x0,uVar8,0);
        goto LAB_00125725;
      }
      pcVar12 = "Wayland: Failed to create xdg-toplevel for window";
    }
    GVar13 = 0;
    _glfwInputError(0x10008,pcVar12);
  }
  else {
    if (_glfw.wl.libdecor.ready == 0) {
      do {
        handleEvents((double *)0x0);
      } while (_glfw.wl.libdecor.ready == 0);
    }
    plVar9 = (*_glfw.wl.libdecor.libdecor_decorate_)
                       (_glfw.wl.libdecor.context,(window->wl).surface,&libdecorFrameInterface,
                        window);
    (window->wl).libdecor.frame = plVar9;
    if (plVar9 == (libdecor_frame *)0x0) {
      _glfwInputError(0x10008,"Wayland: Failed to create libdecor frame");
      goto LAB_001253a0;
    }
    plVar10 = (*_glfw.wl.libdecor.libdecor_state_new_)((window->wl).width,(window->wl).height);
    (*_glfw.wl.libdecor.libdecor_frame_commit_)
              ((window->wl).libdecor.frame,plVar10,(libdecor_configuration *)0x0);
    (*_glfw.wl.libdecor.libdecor_state_free_)(plVar10);
    pcVar12 = (window->wl).appId;
    if (*pcVar12 != '\0') {
      (*_glfw.wl.libdecor.libdecor_frame_set_app_id_)((window->wl).libdecor.frame,pcVar12);
    }
    (*_glfw.wl.libdecor.libdecor_frame_set_title_)((window->wl).libdecor.frame,window->title);
    if ((window->minwidth != -1) && (window->minheight != -1)) {
      (*_glfw.wl.libdecor.libdecor_frame_set_min_content_size_)
                ((window->wl).libdecor.frame,window->minwidth,window->minheight);
    }
    if ((window->maxwidth != -1) && (window->maxheight != -1)) {
      (*_glfw.wl.libdecor.libdecor_frame_set_max_content_size_)
                ((window->wl).libdecor.frame,window->maxwidth,window->maxheight);
    }
    if (window->resizable == 0) {
      (*_glfw.wl.libdecor.libdecor_frame_unset_capabilities_)
                ((window->wl).libdecor.frame,LIBDECOR_ACTION_RESIZE);
    }
    if (window->monitor == (_GLFWmonitor *)0x0) {
      if ((window->wl).maximized != 0) {
        (*_glfw.wl.libdecor.libdecor_frame_set_maximized_)((window->wl).libdecor.frame);
      }
      if (window->decorated == 0) {
        (*_glfw.wl.libdecor.libdecor_frame_set_visibility_)((window->wl).libdecor.frame,false);
      }
      p_Var7 = _glfw.wl.client.proxy_marshal_flags;
      pwVar11 = (wl_proxy *)(window->wl).idleInhibitor;
      if (pwVar11 != (wl_proxy *)0x0) {
        uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
        (*p_Var7)(pwVar11,0,(wl_interface *)0x0,uVar8,1);
        (window->wl).idleInhibitor = (zwp_idle_inhibitor_v1 *)0x0;
      }
    }
    else {
      (*_glfw.wl.libdecor.libdecor_frame_set_fullscreen_)
                ((window->wl).libdecor.frame,(window->monitor->wl).output);
      setIdleInhibitor(window,1);
    }
    (*_glfw.wl.libdecor.libdecor_frame_map_)((window->wl).libdecor.frame);
LAB_00125725:
    (*_glfw.wl.client.display_roundtrip)(_glfw.wl.display);
    GVar13 = 1;
  }
  return GVar13;
}

Assistant:

static GLFWbool createShellObjects(_GLFWwindow* window)
{
    if (_glfw.wl.libdecor.context)
    {
        if (createLibdecorFrame(window))
            return GLFW_TRUE;
    }

    return createXdgShellObjects(window);
}